

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_psbt.cpp
# Opt level: O2

ByteData *
cfd::core::Psbt::CreateRecordKey
          (ByteData *__return_storage_ptr__,uint8_t type,ByteData *prefix,uint8_t sub_type,
          ByteData *sub_key_bytes)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_80;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_68;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_50;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_38;
  
  ByteData::ByteData((ByteData *)&local_38,type);
  ByteData::Serialize((ByteData *)&local_50,prefix);
  ByteData::ByteData((ByteData *)&local_68,sub_type);
  ByteData::Serialize((ByteData *)&local_80,sub_key_bytes);
  ByteData::Concat<cfd::core::ByteData,cfd::core::ByteData,cfd::core::ByteData>
            (__return_storage_ptr__,(ByteData *)&local_38,(ByteData *)&local_50,
             (ByteData *)&local_68,(ByteData *)&local_80);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_80);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_68);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_50);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_38);
  return __return_storage_ptr__;
}

Assistant:

ByteData Psbt::CreateRecordKey(
    uint8_t type, const ByteData &prefix, uint8_t sub_type,
    const ByteData &sub_key_bytes) {
  return ByteData(type).Concat(
      prefix.Serialize(), ByteData(sub_type), sub_key_bytes.Serialize());
}